

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

int Io_NtkWriteNodeGate(FILE *pFile,Abc_Obj_t *pNode,int Length)

{
  Mio_Gate_t *pGate_00;
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Mio_Gate_t *pMVar5;
  int local_44;
  int i;
  Abc_Obj_t *pNode2;
  Mio_Pin_t *pGatePin;
  Mio_Gate_t *pGate;
  int Length_local;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  pGate_00 = (Mio_Gate_t *)(pNode->field_5).pData;
  pcVar2 = Mio_GateReadName(pGate_00);
  fprintf((FILE *)pFile," %-*s ",(ulong)(uint)Length,pcVar2);
  pNode2 = (Abc_Obj_t *)Mio_GateReadPins(pGate_00);
  local_44 = 0;
  while (pNode2 != (Abc_Obj_t *)0x0) {
    pcVar2 = Mio_PinReadName((Mio_Pin_t *)pNode2);
    pAVar3 = Abc_ObjFanin(pNode,local_44);
    pcVar4 = Abc_ObjName(pAVar3);
    fprintf((FILE *)pFile,"%s=%s ",pcVar2,pcVar4);
    pNode2 = (Abc_Obj_t *)Mio_PinReadNext((Mio_Pin_t *)pNode2);
    local_44 = local_44 + 1;
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if (local_44 == iVar1) {
    pcVar2 = Mio_GateReadOutName(pGate_00);
    pAVar3 = Abc_ObjFanout0(pNode);
    pcVar4 = Abc_ObjName(pAVar3);
    fprintf((FILE *)pFile,"%s=%s",pcVar2,pcVar4);
    pMVar5 = Mio_GateReadTwin(pGate_00);
    if (pMVar5 == (Mio_Gate_t *)0x0) {
      pFile_local._4_4_ = 0;
    }
    else {
      pAVar3 = Abc_NtkFetchTwinNode(pNode);
      if (pAVar3 == (Abc_Obj_t *)0x0) {
        if (Io_NtkWriteNodeGate::fReport == 0) {
          Io_NtkWriteNodeGate::fReport = 1;
          pcVar2 = Mio_GateReadName(pGate_00);
          printf("Warning: Missing second output of gate(s) \"%s\".\n",pcVar2);
        }
        pFile_local._4_4_ = 0;
      }
      else {
        pcVar2 = Mio_GateReadOutName((Mio_Gate_t *)(pAVar3->field_5).pData);
        pAVar3 = Abc_ObjFanout0(pAVar3);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar4);
        pFile_local._4_4_ = 1;
      }
    }
    return pFile_local._4_4_;
  }
  __assert_fail("i == Abc_ObjFaninNum(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioWriteBlif.c"
                ,0x24a,"int Io_NtkWriteNodeGate(FILE *, Abc_Obj_t *, int)");
}

Assistant:

unsigned Io_NtkWriteNodeGate( FILE * pFile, Abc_Obj_t * pNode )
{
    Mio_Gate_t * pGate = (Mio_Gate_t *)pNode->pData;
    Mio_Pin_t * pGatePin;
    int i;
    // write the node gate
    for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        fprintf( pFile, "%s_", Abc_ObjName( Abc_ObjFanin(pNode,i) ) );
    assert ( i == Abc_ObjFaninNum(pNode) );
    fprintf( pFile, "%s_%s\t", Abc_ObjName( Abc_ObjFanout0(pNode) ), Mio_GateReadName(pGate) );
    return Mio_GateReadArea(pGate);
}